

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O1

bool __thiscall GGSock::FileServer::clearAllFiles(FileServer *this)

{
  ulong *puVar1;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var2;
  long lVar3;
  pointer pFVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  difference_type __n;
  ulong uVar8;
  pthread_mutex_t *__mutex;
  char *__end;
  pointer this_00;
  long *local_98 [2];
  long local_88 [2];
  TFilesize local_78;
  long *local_70 [2];
  long local_60 [2];
  int32_t local_50;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 == 0) {
    _Var2._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    (_Var2._M_head_impl)->currentFileUpdateId = 0;
    lVar3 = *(long *)&((_Var2._M_head_impl)->fileUsed).super__Bvector_base<std::allocator<bool>_>;
    uVar7 = (*(int *)&((_Bit_iterator *)((long)&(_Var2._M_head_impl)->fileUsed + 0x10))->
                      super__Bit_iterator_base - (int)lVar3) * 8 +
            *(uint *)((long)&(_Var2._M_head_impl)->fileUsed + 0x18);
    if (0 < (int)uVar7) {
      uVar8 = 0;
      do {
        bVar5 = (byte)uVar8 & 0x3f;
        puVar1 = (ulong *)(lVar3 + (uVar8 >> 6) * 8);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar7);
    }
    this_00 = *(pointer *)
               &((_Var2._M_head_impl)->files).
                super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
    ;
    pFVar4 = *(pointer *)((long)&(_Var2._M_head_impl)->files + 8);
    if (this_00 != pFVar4) {
      do {
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"?","");
        local_78 = 0;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"?","");
        local_50 = 0;
        local_48 = (void *)0x0;
        uStack_40 = 0;
        local_38 = 0;
        std::__cxx11::string::operator=((string *)this_00,(string *)local_98);
        *(TFilesize *)((long)&this_00->info + 0x20) = local_78;
        std::__cxx11::string::operator=((string *)((long)&this_00->info + 0x28),(string *)local_70);
        *(int32_t *)((long)&this_00->info + 0x48) = local_50;
        std::vector<char,_std::allocator<char>_>::_M_move_assign(&this_00->data,&local_48);
        if (local_48 != (void *)0x0) {
          operator_delete(local_48,local_38 - (long)local_48);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pFVar4);
    }
    ((this->m_impl)._M_t.
     super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
     ._M_t.
     super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
     .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->changedFileInfos =
         true;
    pthread_mutex_unlock(__mutex);
    return true;
  }
  std::__throw_system_error(iVar6);
}

Assistant:

bool FileServer::clearAllFiles() {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        m_impl->currentFileUpdateId = 0;
        for (int i = 0; i < (int) m_impl->fileUsed.size(); ++i) {
            m_impl->fileUsed[i] = false;
        }

        for (auto & file : m_impl->files) {
            file = {};
        }

        m_impl->changedFileInfos = true;
    }

    return true;
}